

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MPP_RET mpp_cluster_queue_init(ClusterQueue *queue,MppCluster *cluster)

{
  pthread_mutexattr_t attr;
  
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
  pthread_mutex_init((pthread_mutex_t *)&queue->lock,(pthread_mutexattr_t *)&attr);
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  queue->cluster = cluster;
  (queue->list).next = &queue->list;
  (queue->list).prev = &queue->list;
  queue->count = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_cluster_queue_init(ClusterQueue *queue, MppCluster *cluster)
{
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&queue->lock, &attr);
    pthread_mutexattr_destroy(&attr);

    queue->cluster = cluster;
    INIT_LIST_HEAD(&queue->list);
    queue->count = 0;

    return MPP_OK;
}